

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix_with_column_compression.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>
::_insert_column(Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>
                 *this,Index columnIndex)

{
  uint y;
  pointer p;
  node_ptr plVar1;
  pointer puVar2;
  unsigned_long uVar3;
  pointer ppCVar4;
  Column *pCVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  ulong uVar9;
  pair<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_bool>
  res;
  node_ptr local_38;
  
  uVar9 = (ulong)columnIndex;
  p = (this->repToColumn_).
      super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar9];
  plVar1 = (p->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar1 == (node_ptr)0x0 || plVar1 == (node_ptr)&(p->super_Column).column_) {
    Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>
    ::destroy((this->columnPool_)._M_t.
              super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>_>_>
              .
              super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>_*,_false>
              ._M_head_impl,p);
    (this->repToColumn_).
    super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar9] = (Column *)0x0;
  }
  else {
    p->rep_ = columnIndex;
    boost::intrusive::
    bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
    ::insert_unique((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                     *)&local_38,(reference)&this->columnToRep_);
    y = *(uint *)&local_38[1].parent_;
    if (y != columnIndex) {
      boost::
      disjoint_sets_with_storage<boost::typed_identity_property_map<unsigned_long>,_boost::typed_identity_property_map<unsigned_long>,_boost::find_with_full_path_compression>
      ::link<unsigned_int>(&this->columnClasses_,columnIndex,y);
      puVar2 = (this->columnClasses_).parent.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar2[uVar9];
      uVar7 = uVar3;
      uVar6 = uVar9;
      uVar8 = uVar9;
      if (uVar3 != uVar9) {
        do {
          uVar8 = uVar7;
          uVar7 = puVar2[uVar8];
        } while (puVar2[uVar8] != uVar8);
      }
      while (uVar7 = uVar3, uVar8 != uVar7) {
        puVar2[uVar6] = uVar8;
        uVar6 = uVar7;
        uVar3 = puVar2[uVar7];
      }
      Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>
      ::destroy((this->columnPool_)._M_t.
                super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>_>_>
                .
                super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>_*,_false>
                ._M_head_impl,
                (this->repToColumn_).
                super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar9]);
      (this->repToColumn_).
      super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar9] = (Column *)0x0;
      if ((Index)uVar8 == columnIndex) {
        ppCVar4 = (this->repToColumn_).
                  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar5 = ppCVar4[y];
        ppCVar4[y] = ppCVar4[uVar9];
        ppCVar4[uVar9] = pCVar5;
        *(Index *)&local_38[1].parent_ = columnIndex;
      }
    }
  }
  return;
}

Assistant:

inline void Base_matrix_with_column_compression<Master_matrix>::_insert_column(Index columnIndex)
{
  Column& col = *repToColumn_[columnIndex];

  if (col.is_empty()) {
    columnPool_->destroy(&col);  // delete curr_col;
    repToColumn_[columnIndex] = nullptr;
    return;
  }

  col.set_rep(columnIndex);
  auto res = columnToRep_.insert(col);
  if (res.first->get_rep() != columnIndex) {  //if true, then redundant column
    _insert_double_column(columnIndex, res.first);
  }
}